

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_examples.cpp
# Opt level: O0

void density_tests::
     SpQueueSamples<(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1>::
     spinlocking_heterogeneous_queue_put_transaction_samples(void)

{
  bool bVar1;
  int *piVar2;
  ostream *poVar3;
  runtime_type<> *prVar4;
  type_info *ptVar5;
  char *pcVar6;
  double *pdVar7;
  reentrant_put_transaction<double> typed_put;
  reentrant_put_transaction<void> untyped_put;
  int value_2;
  SpQueue queue_14;
  SpQueue queue_13;
  put_transaction<void> put_3;
  int value_1;
  SpQueue queue_12;
  put_transaction<int> put_1;
  put_transaction<void> put_2;
  int value;
  SpQueue queue_11;
  put_transaction<int> put;
  SpQueue queue_10;
  put_transaction<void> transaction_2;
  SpQueue queue_9;
  put_transaction<void> transaction_1;
  SpQueue queue_8;
  anon_class_8_1_a8890831 post_message_5;
  SpQueue queue_7;
  anon_class_8_1_a8890831 post_message_4;
  SpQueue queue_6;
  int msg_2_1;
  int msg_1_1;
  anon_class_16_2_e5d92710 consume_all_msgs_1;
  time_point start_time_1;
  anon_class_8_1_a8890831 post_message_3;
  SpQueue queue_5;
  anon_class_8_1_a8890831 post_message_2;
  SpQueue queue_4;
  anon_class_8_1_a8890831 post_message_1;
  SpQueue queue_3;
  int msg_2;
  int msg_1;
  anon_class_16_2_e5d92710 consume_all_msgs;
  time_point start_time;
  anon_class_8_1_a8890831 post_message;
  SpQueue queue_2;
  put_transaction<void> transaction2_1;
  put_transaction<int> transaction1_1;
  SpQueue queue_1;
  type transaction2;
  put_transaction<int> transaction1;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue;
  put_transaction<void> transaction;
  bool local_e89;
  double local_e58;
  reentrant_put_transaction<double> local_e50;
  reentrant_put_transaction<double> local_e30;
  runtime_type local_e10;
  reentrant_put_transaction<void> local_e08;
  reentrant_put_transaction<void> local_de8;
  undefined4 local_dc4;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_dc0;
  int local_d24;
  put_transaction<int> local_d20;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_d00;
  runtime_type local_c50;
  put_transaction<void> local_c48;
  put_transaction<void> local_c28;
  undefined4 local_c04;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_c00;
  int local_b54;
  put_transaction<int> local_b50;
  put_transaction<int> local_b30;
  runtime_type local_b10;
  put_transaction<void> local_b08;
  put_transaction<void> local_ae8;
  undefined4 local_ac4;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_ac0;
  consume_operation local_a08;
  int local_9ec;
  put_transaction<int> local_9e8;
  int local_9c4;
  put_transaction<int> local_9c0;
  put_transaction<int> local_9a0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_980;
  int local_8c4;
  put_transaction<int> local_8c0;
  put_transaction<void> local_8a0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_880;
  int local_7c4;
  put_transaction<int> local_7c0;
  put_transaction<void> local_7a0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_780;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *local_6c8;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_6c0;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *local_608;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_600;
  undefined4 local_568;
  undefined4 local_564;
  anon_class_16_2_e5d92710 local_560;
  time_point local_550;
  anon_class_8_1_a8890831 local_548;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_540;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *local_488;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_480;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *local_3c8;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_3c0;
  undefined4 local_328;
  undefined4 local_324;
  anon_class_16_2_e5d92710 local_320;
  time_point local_310;
  anon_class_8_1_a8890831 local_308;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_300;
  put_transaction<void> local_268;
  int local_244;
  put_transaction<int> local_240;
  put_transaction<int> local_220;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_200;
  put_transaction<int> local_178;
  int local_144;
  put_transaction<int> local_140;
  put_transaction<int> local_120;
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_100;
  put_transaction<void> local_70 [3];
  
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::put_transaction(local_70);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::put_transaction<void>::empty(local_70);
  if (!bVar1) {
    __assert_fail("transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x135,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction(local_70);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_100);
  local_144 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_push<int>(&local_140,&local_100,&local_144);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<int>::put_transaction<int,void>((put_transaction<int> *)&local_120,&local_140);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_140);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<int>::put_transaction<int,void>((put_transaction<int> *)&local_178,&local_120);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::put_transaction<int>::empty(&local_120);
  if (!bVar1) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x152,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  piVar2 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::put_transaction<int>::element<int,_nullptr>(&local_178);
  if (*piVar2 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x153,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::commit(&local_178);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::put_transaction<int>::empty(&local_178);
  if (!bVar1) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x157,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_178);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_120);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_100);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_200);
  local_244 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_push<int>(&local_240,&local_200,&local_244);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<int>::put_transaction<int,void>((put_transaction<int> *)&local_220,&local_240);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_240);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::put_transaction(&local_268);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<void>::operator=((put_transaction<void> *)&local_268,&local_220);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::put_transaction<int>::empty(&local_220);
  if (!bVar1) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x187,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::commit(&local_268);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::put_transaction<void>::empty(&local_268);
  if (!bVar1) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x189,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction(&local_268);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_220);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_200);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_300);
  local_308.queue = &local_300;
  local_310.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_320.start_time = &local_310;
  local_324 = 0x2a;
  local_328 = 0x237;
  local_320.queue = &local_300;
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            (&local_308,&local_324,4);
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            (&local_308,&local_328,4);
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_16_2_e5d92710::operator()
            (&local_320);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_300);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_3c0);
  local_3c8 = &local_3c0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_3c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_480);
  local_488 = &local_480;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_480);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_540);
  local_548.queue = &local_540;
  local_550.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_560.start_time = &local_550;
  local_564 = 0x2a;
  local_568 = 0x237;
  local_560.queue = &local_540;
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            (&local_548,&local_564,4);
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_8_1_a8890831::operator()
            (&local_548,&local_568,4);
  spinlocking_heterogeneous_queue_put_transaction_samples::anon_class_16_2_e5d92710::operator()
            (&local_560);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_540);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_600);
  local_608 = &local_600;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_600);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_6c0);
  local_6c8 = &local_6c0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_6c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_780);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::put_transaction(&local_7a0);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::put_transaction<void>::empty(&local_7a0);
  if (!bVar1) {
    __assert_fail("transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x278,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_7c4 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_push<int>(&local_7c0,&local_780,&local_7c4);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<void>::operator=((put_transaction<void> *)&local_7a0,&local_7c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_7c0);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::put_transaction<void>::empty(&local_7a0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x27b,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction(&local_7a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_780);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_880);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::put_transaction(&local_8a0);
  bVar1 = density::sp_heter_queue::put_transaction::operator_cast_to_bool
                    ((put_transaction *)&local_8a0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x286,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_8c4 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_push<int>(&local_8c0,&local_880,&local_8c4);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<void>::operator=((put_transaction<void> *)&local_8a0,&local_8c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_8c0);
  bVar1 = density::sp_heter_queue::put_transaction::operator_cast_to_bool
                    ((put_transaction *)&local_8a0);
  if (!bVar1) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x289,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction(&local_8a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_880);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_980);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::empty(&local_980);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x294,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_9c4 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_push<int>(&local_9c0,&local_980,&local_9c4);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<int>::put_transaction<int,void>((put_transaction<int> *)&local_9a0,&local_9c0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_9c0);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::put_transaction<int>::empty(&local_9a0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x298,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::cancel(&local_9a0);
  bVar1 = density::
          sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::empty(&local_980);
  local_e89 = false;
  if (bVar1) {
    local_e89 = density::
                sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                ::put_transaction<int>::empty(&local_9a0);
  }
  if (local_e89 == false) {
    __assert_fail("queue.empty() && put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x29a,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  local_9ec = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_push<int>(&local_9e8,&local_980,&local_9ec);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<int>::operator=((put_transaction<int> *)&local_9a0,&local_9e8);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_9e8);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::commit(&local_9a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_start_consume(&local_a08,&local_980);
  piVar2 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::consume_operation::element<int>(&local_a08);
  if (*piVar2 != 0x2a) {
    __assert_fail("queue.try_start_consume().template element<int>() == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x29f,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::consume_operation::~consume_operation(&local_a08);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_9a0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_980);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_ac0);
  local_ac4 = 0x2a;
  local_b10.m_feature_table = (tuple_type *)density::runtime_type<>::make<int>();
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_dyn_push_copy(&local_b08,&local_ac0,&local_b10,&local_ac4);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<void>::put_transaction<void,void>
            ((put_transaction<void> *)&local_ae8,&local_b08);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction(&local_b08);
  piVar2 = (int *)density::
                  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  ::put_transaction<void>::element_ptr(&local_ae8);
  if (*piVar2 != 0x2a) {
    __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x2ab,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Putting an ");
  prVar4 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::put_transaction<void>::complete_type(&local_ae8);
  ptVar5 = density::runtime_type<>::type_info(prVar4);
  pcVar6 = std::type_info::name(ptVar5);
  poVar3 = std::operator<<(poVar3,pcVar6);
  poVar3 = std::operator<<(poVar3,"...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::commit(&local_ae8);
  local_b54 = 1;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_push<int>(&local_b50,&local_ac0,&local_b54);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<int>::put_transaction<int,void>((put_transaction<int> *)&local_b30,&local_b50);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_b50);
  piVar2 = (int *)density::
                  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  ::put_transaction<int>::element_ptr(&local_b30);
  if (*piVar2 != 1) {
    __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x2b2,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  piVar2 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::put_transaction<int>::element<int,_nullptr>(&local_b30);
  if (*piVar2 != 1) {
    __assert_fail("put_1.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x2b3,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::commit(&local_b30);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_b30);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction(&local_ae8);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_ac0);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_c00);
  local_c04 = 0x2a;
  local_c50.m_feature_table = (tuple_type *)density::runtime_type<>::make<int>();
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_dyn_push_copy(&local_c48,&local_c00,&local_c50,&local_c04);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::put_transaction<void>::put_transaction<void,void>
            ((put_transaction<void> *)&local_c28,&local_c48);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction(&local_c48);
  prVar4 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::put_transaction<void>::complete_type(&local_c28);
  bVar1 = density::runtime_type<>::is<int>(prVar4);
  if (!bVar1) {
    __assert_fail("put.complete_type().template is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                  ,0x2c0,
                  "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Putting an ");
  prVar4 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::put_transaction<void>::complete_type(&local_c28);
  ptVar5 = density::runtime_type<>::type_info(prVar4);
  pcVar6 = std::type_info::name(ptVar5);
  poVar3 = std::operator<<(poVar3,pcVar6);
  poVar3 = std::operator<<(poVar3,"...");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<void>::~put_transaction(&local_c28);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_c00);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_d00);
  local_d24 = 0x2a;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_push<int>(&local_d20,&local_d00,&local_d24);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::put_transaction<int>::~put_transaction(&local_d20);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_heter_queue(&local_d00);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_heter_queue(&local_dc0);
  local_dc4 = 0x2a;
  local_e10.m_feature_table = (tuple_type *)density::runtime_type<>::make<int>();
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_dyn_push_copy(&local_e08,&local_dc0,&local_e10,&local_dc4);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)&local_de8,&local_e08);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_e08);
  local_e58 = 42.0;
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::start_reentrant_push<double>(&local_e50,&local_dc0,&local_e58);
  density::
  sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::reentrant_put_transaction<double>::reentrant_put_transaction<double,void>
            ((reentrant_put_transaction<double> *)&local_e30,&local_e50);
  density::
  sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<double>::~reentrant_put_transaction(&local_e50);
  pdVar7 = density::
           sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<double>::element<double,_nullptr>(&local_e30);
  if ((*pdVar7 == 42.0) && (!NAN(*pdVar7))) {
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<double>::~reentrant_put_transaction(&local_e30);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::reentrant_put_transaction<void>::~reentrant_put_transaction(&local_de8);
    density::
    sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::~sp_heter_queue(&local_dc0);
    return;
  }
  __assert_fail("typed_put.element() == 42.",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_queue_examples.cpp"
                ,0x2df,
                "static void density_tests::SpQueueSamples<density::concurrency_single, density::concurrency_multiple>::spinlocking_heterogeneous_queue_put_transaction_samples() [PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
               );
}

Assistant:

static void spinlocking_heterogeneous_queue_put_transaction_samples()
{
    using namespace density;

    {
        //! [sp_heter_queue put_transaction default_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        typename SpQueue::template put_transaction<> transaction;
        assert(transaction.empty());
        //! [sp_heter_queue put_transaction default_construct example 1]
    }
    {
        //! [sp_heter_queue put_transaction copy_construct example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        static_assert(
          !std::is_copy_constructible<typename SpQueue::template put_transaction<>>::value, "");
        //! [sp_heter_queue put_transaction copy_construct example 1]
    }
    {
        //! [sp_heter_queue put_transaction copy_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        static_assert(
          !std::is_copy_assignable<typename SpQueue::template put_transaction<>>::value, "");
        //! [sp_heter_queue put_transaction copy_assign example 1]
    }
    {
        //! [sp_heter_queue put_transaction move_construct example 1]
        sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>
             queue;
        auto transaction1 = queue.start_push(1);

        // move from transaction1 to transaction2
        auto transaction2(std::move(transaction1));
        assert(transaction1.empty());
        assert(transaction2.element() == 1);

        // commit transaction2
        transaction2.commit();
        assert(transaction2.empty());

        //! [sp_heter_queue put_transaction move_construct example 1]

        //! [sp_heter_queue put_transaction move_construct example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        // put_transaction<void> can be move constructed from any put_transaction<T>
        static_assert(
          std::is_constructible<
            typename SpQueue::template put_transaction<void>,
            typename SpQueue::template put_transaction<void> &&>::value,
          "");
        static_assert(
          std::is_constructible<
            typename SpQueue::template put_transaction<void>,
            typename SpQueue::template put_transaction<int> &&>::value,
          "");

        // put_transaction<T> can be move constructed only from put_transaction<T>
        static_assert(
          !std::is_constructible<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<void> &&>::value,
          "");
        static_assert(
          !std::is_constructible<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<float> &&>::value,
          "");
        static_assert(
          std::is_constructible<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<int> &&>::value,
          "");
        //! [sp_heter_queue put_transaction move_construct example 2]
    }
    {
        //! [sp_heter_queue put_transaction move_assign example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;
        auto    transaction1 = queue.start_push(1);

        typename SpQueue::template put_transaction<> transaction2;
        transaction2 = std::move(transaction1);
        assert(transaction1.empty());
        transaction2.commit();
        assert(transaction2.empty());
        //! [sp_heter_queue put_transaction move_assign example 1]
    }
    {
        //! [sp_heter_queue put_transaction move_assign example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        // put_transaction<void> can be move assigned from any put_transaction<T>
        static_assert(
          std::is_assignable<
            typename SpQueue::template put_transaction<void>,
            typename SpQueue::template put_transaction<void> &&>::value,
          "");
        static_assert(
          std::is_assignable<
            typename SpQueue::template put_transaction<void>,
            typename SpQueue::template put_transaction<int> &&>::value,
          "");

        // put_transaction<T> can be move assigned only from put_transaction<T>
        static_assert(
          !std::is_assignable<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<void> &&>::value,
          "");
        static_assert(
          !std::is_assignable<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<float> &&>::value,
          "");
        static_assert(
          std::is_assignable<
            typename SpQueue::template put_transaction<int>,
            typename SpQueue::template put_transaction<int> &&>::value,
          "");
        //! [sp_heter_queue put_transaction move_assign example 2]
    }
    {
        //! [sp_heter_queue put_transaction raw_allocate example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        SpQueue queue;
        struct Msg
        {
            std::chrono::high_resolution_clock::time_point m_time =
              std::chrono::high_resolution_clock::now();
            size_t m_len  = 0;
            void * m_data = nullptr;
        };

        auto post_message = [&queue](const void * i_data, size_t i_len) {
            auto transaction             = queue.template start_emplace<Msg>();
            transaction.element().m_len  = i_len;
            transaction.element().m_data = transaction.raw_allocate(i_len, 1);
            memcpy(transaction.element().m_data, i_data, i_len);

            assert(
              !transaction
                 .empty()); // a put transaction is not empty if it's bound to an element being put
            transaction.commit();
            assert(transaction.empty()); // the commit makes the transaction empty
        };

        auto const start_time = std::chrono::high_resolution_clock::now();

        auto consume_all_msgs = [&queue, &start_time] {
            while (auto consume = queue.try_start_consume())
            {
                auto const & msg      = consume.template element<Msg>();
                auto const   checksum = compute_checksum(msg.m_data, msg.m_len);
                std::cout << "Message with checksum " << checksum << " at ";
                std::cout << (msg.m_time - start_time).count() << std::endl;
                consume.commit();
            }
        };

        int msg_1 = 42, msg_2 = 567;
        post_message(&msg_1, sizeof(msg_1));
        post_message(&msg_2, sizeof(msg_2));

        consume_all_msgs();
        //! [sp_heter_queue put_transaction raw_allocate example 1]
    }
    {
        //! [sp_heter_queue put_transaction raw_allocate_copy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            size_t m_len   = 0;
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const char * i_data, size_t i_len) {
            auto transaction              = queue.template start_emplace<Msg>();
            transaction.element().m_len   = i_len;
            transaction.element().m_chars = transaction.raw_allocate_copy(i_data, i_data + i_len);
            memcpy(transaction.element().m_chars, i_data, i_len);
            transaction.commit();
        };
        //! [sp_heter_queue put_transaction raw_allocate_copy example 1]
        (void)post_message;
    }
    {
        //! [sp_heter_queue put_transaction raw_allocate_copy example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const std::string & i_string) {
            auto transaction              = queue.template start_emplace<Msg>();
            transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
            transaction.commit();
        };
        //! [sp_heter_queue put_transaction raw_allocate_copy example 2]
        (void)post_message;
    }
    {
        //! [sp_heter_queue put_transaction try_raw_allocate example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;
        SpQueue queue;
        struct Msg
        {
            std::chrono::high_resolution_clock::time_point m_time =
              std::chrono::high_resolution_clock::now();
            size_t m_len  = 0;
            void * m_data = nullptr;
        };

        auto post_message = [&queue](const void * i_data, size_t i_len) {
            if (auto transaction = queue.template try_start_emplace<Msg>(progress_lock_free))
            {
                // if we fail to allocate the raw block, we don't commit the put transaction
                transaction.element().m_len = i_len;
                transaction.element().m_data =
                  transaction.try_raw_allocate(progress_lock_free, i_len, 1);
                if (transaction.element().m_data)
                {
                    memcpy(transaction.element().m_data, i_data, i_len);

                    assert(
                      !transaction
                         .empty()); // a put transaction is not empty if it's bound to an element being put
                    transaction.commit();
                    assert(transaction.empty()); // the commit makes the transaction empty
                }
            }
        };

        auto const start_time = std::chrono::high_resolution_clock::now();

        auto consume_all_msgs = [&queue, &start_time] {
            while (auto consume = queue.try_start_consume())
            {
                auto const & msg      = consume.template element<Msg>();
                auto const   checksum = compute_checksum(msg.m_data, msg.m_len);
                std::cout << "Message with checksum " << checksum << " at ";
                std::cout << (msg.m_time - start_time).count() << std::endl;
                consume.commit();
            }
        };

        int msg_1 = 42, msg_2 = 567;
        post_message(&msg_1, sizeof(msg_1));
        post_message(&msg_2, sizeof(msg_2));

        consume_all_msgs();
        //! [sp_heter_queue put_transaction try_raw_allocate example 1]
    }
    {
        //! [sp_heter_queue put_transaction try_raw_allocate_copy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            size_t m_len   = 0;
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const char * i_data, size_t i_len) {
            auto transaction = queue.template try_start_emplace<Msg>(progress_lock_free);

            // if we fail to allocate the raw block, we don't commit the put transaction
            transaction.element().m_len = i_len;
            transaction.element().m_chars =
              transaction.try_raw_allocate_copy(progress_lock_free, i_data, i_data + i_len);
            if (transaction.element().m_chars)
            {
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            }
        };
        //! [sp_heter_queue put_transaction try_raw_allocate_copy example 1]
        (void)post_message;
    }
    {
        //! [sp_heter_queue put_transaction try_raw_allocate_copy example 2]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        struct Msg
        {
            char * m_chars = nullptr;
        };
        auto post_message = [&queue](const std::string & i_string) {
            auto transaction = queue.template try_start_emplace<Msg>(progress_lock_free);

            // if we fail to allocate the raw block, we don't commit the put transaction
            transaction.element().m_chars =
              transaction.try_raw_allocate_copy(progress_lock_free, i_string);
            if (transaction.element().m_chars)
            {
                transaction.commit();
            }
        };
        //! [sp_heter_queue put_transaction try_raw_allocate_copy example 2]
        (void)post_message;
    }
    {
        //! [sp_heter_queue put_transaction empty example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        typename SpQueue::template put_transaction<> transaction;
        assert(transaction.empty());

        transaction = queue.start_push(1);
        assert(!transaction.empty());
        //! [sp_heter_queue put_transaction empty example 1]
    }
    {
        //! [sp_heter_queue put_transaction operator_bool example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        typename SpQueue::template put_transaction<> transaction;
        assert(!transaction);

        transaction = queue.start_push(1);
        assert(transaction);
        //! [sp_heter_queue put_transaction operator_bool example 1]
    }
    {
        //! [sp_heter_queue put_transaction cancel example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        // start and cancel a put
        assert(queue.empty());
        auto put = queue.start_push(42);
        /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
                the queue during a non-reentrant put transaction. */
        assert(!put.empty());
        put.cancel();
        assert(queue.empty() && put.empty());

        // start and commit a put
        put = queue.start_push(42);
        put.commit();
        assert(queue.try_start_consume().template element<int>() == 42);
        //! [sp_heter_queue put_transaction cancel example 1]
    }
    {
        //! [sp_heter_queue put_transaction element_ptr example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto put   = queue.start_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
        assert(*static_cast<int *>(put.element_ptr()) == 42);
        std::cout << "Putting an " << put.complete_type().type_info().name() << "..." << std::endl;
        put.commit();
        //! [sp_heter_queue put_transaction element_ptr example 1]

        //! [sp_heter_queue put_transaction element_ptr example 2]
        auto put_1 = queue.start_push(1);
        assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
        assert(put_1.element() == 1);                          // this is better
        put_1.commit();
        //! [sp_heter_queue put_transaction element_ptr example 2]
    }
    {
        //! [sp_heter_queue put_transaction complete_type example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto put   = queue.start_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
        assert(put.complete_type().template is<int>());
        std::cout << "Putting an " << put.complete_type().type_info().name() << "..." << std::endl;
        //! [sp_heter_queue put_transaction complete_type example 1]
    }
    {
        //! [sp_heter_queue put_transaction destroy example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        queue.start_push(42); /* this transaction is destroyed without being committed,
                                    so it gets canceled automatically. */
        //! [sp_heter_queue put_transaction destroy example 1]
    }
    {
        //! [sp_heter_queue typed_put_transaction element example 1]
        using SpQueue =
          sp_heter_queue<runtime_type<>, default_allocator, PROD_CARDINALITY, CONSUMER_CARDINALITY>;

        SpQueue queue;

        int  value = 42;
        auto untyped_put =
          queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

        auto typed_put = queue.start_reentrant_push(42.);

        /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
                transaction to a typed transaction */

        assert(typed_put.element() == 42.);

        //! [sp_heter_queue typed_put_transaction element example 1]
    }
}